

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O1

void __thiscall
burst::dynamic_tuple::dynamic_tuple<int,double,bool,std::__cxx11::string,void>
          (dynamic_tuple *this,int *head,double *tail,bool *tail_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_2)

{
  char *pcVar1;
  int8_t *piVar2;
  
  this->m_capacity = 0x38;
  pcVar1 = (char *)operator_new__(0x38);
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pcVar1[8] = '\0';
  pcVar1[9] = '\0';
  pcVar1[10] = '\0';
  pcVar1[0xb] = '\0';
  pcVar1[0xc] = '\0';
  pcVar1[0xd] = '\0';
  pcVar1[0xe] = '\0';
  pcVar1[0xf] = '\0';
  pcVar1[0x10] = '\0';
  pcVar1[0x11] = '\0';
  pcVar1[0x12] = '\0';
  pcVar1[0x13] = '\0';
  pcVar1[0x14] = '\0';
  pcVar1[0x15] = '\0';
  pcVar1[0x16] = '\0';
  pcVar1[0x17] = '\0';
  pcVar1[0x18] = '\0';
  pcVar1[0x19] = '\0';
  pcVar1[0x1a] = '\0';
  pcVar1[0x1b] = '\0';
  pcVar1[0x1c] = '\0';
  pcVar1[0x1d] = '\0';
  pcVar1[0x1e] = '\0';
  pcVar1[0x1f] = '\0';
  pcVar1[0x20] = '\0';
  pcVar1[0x21] = '\0';
  pcVar1[0x22] = '\0';
  pcVar1[0x23] = '\0';
  pcVar1[0x24] = '\0';
  pcVar1[0x25] = '\0';
  pcVar1[0x26] = '\0';
  pcVar1[0x27] = '\0';
  pcVar1[0x28] = '\0';
  pcVar1[0x29] = '\0';
  pcVar1[0x2a] = '\0';
  pcVar1[0x2b] = '\0';
  pcVar1[0x2c] = '\0';
  pcVar1[0x2d] = '\0';
  pcVar1[0x2e] = '\0';
  pcVar1[0x2f] = '\0';
  pcVar1[0x30] = '\0';
  pcVar1[0x31] = '\0';
  pcVar1[0x32] = '\0';
  pcVar1[0x33] = '\0';
  pcVar1[0x34] = '\0';
  pcVar1[0x35] = '\0';
  pcVar1[0x36] = '\0';
  pcVar1[0x37] = '\0';
  (this->m_data)._M_t.super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
  super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
  super__Head_base<0UL,_signed_char_*,_false>._M_head_impl = pcVar1;
  (this->m_objects).
  super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_objects).
  super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_objects).
  super__Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_volume = 0;
  piVar2 = force_align<int>(this,head);
  accomodate<int>(this,head,piVar2);
  piVar2 = force_align<double>(this,tail);
  accomodate<double>(this,tail,piVar2);
  push_back_no_realloc<bool>(this,tail_1);
  piVar2 = force_align<std::__cxx11::string>(this,tail_2);
  accomodate<std::__cxx11::string>(this,tail_2,piVar2);
  return;
}

Assistant:

explicit dynamic_tuple (Head && head, Tail && ... tail):
            m_capacity(aligned_volume_v<Head, Tail...>),
            m_data(std::make_unique<std::int8_t[]>(m_capacity))
        {
            try
            {
                push_back_no_realloc(std::forward<Head>(head));
                BURST_EXPAND_VARIADIC(push_back_no_realloc(std::forward<Tail>(tail)));
            }
            catch (...)
            {
                destroy_all();
                throw;
            }
        }